

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void check_bin_z85<zmq::sockopt::array_option<48,2>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  int iVar1;
  undefined8 *optval_;
  value_type_conflict3 *__val;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  AssertionHandler catchAssertionHandler;
  string bv;
  uint8_t *dret;
  string sv;
  AssertionHandler local_e8;
  ExprLhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  enable_if_t<Detail::conjunction<Detail::is_eq_comparable<basic_string<char>_&,_basic_string<char>_&>,_Detail::negation<capture_by_value<std::remove_reference_t<basic_string<char>_&>_>_>_>::value,_BinaryExpr<basic_string<char>_&,_basic_string<char>_&>_>
  local_58;
  
  optval_ = (undefined8 *)operator_new(0x20);
  *optval_ = 0;
  optval_[1] = 0;
  optval_[2] = 0;
  optval_[3] = 0;
  local_90._16_8_ = zmq_z85_decode(optval_,(param_2->_M_dataplus)._M_p);
  local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1a0995;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression.m_result = false;
  local_58.super_ITransientExpression._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "dret != nullptr";
  Catch::AssertionHandler::AssertionHandler
            (&local_e8,macroName,(SourceLineInfo *)&local_58,capturedExpression,ContinueOnFailure);
  local_58.m_rhs = &local_78;
  local_58.m_lhs =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_90 + 0x10);
  local_58.super_ITransientExpression.m_result = local_90._16_8_ != 0;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_58.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001df810;
  local_58.m_op.m_start = "!=";
  local_58.m_op.m_size = 2;
  Catch::AssertionHandler::handleExpr(&local_e8,&local_58.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_e8);
  if (local_e8.m_completed == false) {
    (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  zmq::detail::socket_base::set_option
            (param_1,0x30,(param_2->_M_dataplus)._M_p,param_2->_M_string_length);
  zmq::detail::socket_base::set_option(param_1,0x30,optval_,0x20);
  zmq::detail::socket_base::get<48,2>(&local_78,param_1,0x400);
  local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1a0995;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression.m_result = false;
  local_58.super_ITransientExpression._10_6_ = 0;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0xd;
  capturedExpression_00.m_start = "sv == str_val";
  Catch::AssertionHandler::AssertionHandler
            (&local_e8,macroName_00,(SourceLineInfo *)&local_58,capturedExpression_00,
             ContinueOnFailure);
  local_a0.m_lhs = &local_78;
  Catch::operator==(&local_58,&local_a0,param_2);
  Catch::AssertionHandler::handleExpr(&local_e8,&local_58.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_e8);
  if (local_e8.m_completed == false) {
    (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  zmq::detail::socket_base::get<48,2>(&local_a0,param_1,0x20);
  local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1a0995;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression.m_result = false;
  local_58.super_ITransientExpression._10_6_ = 0;
  macroName_01.m_size = 7;
  macroName_01.m_start = "REQUIRE";
  capturedExpression_01.m_size = 0x1b;
  capturedExpression_01.m_start = "bv.size() == bin_val.size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_e8,macroName_01,(SourceLineInfo *)&local_58,capturedExpression_01,Normal);
  local_58.super_ITransientExpression.m_result =
       local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001df150;
  local_58.m_lhs = local_98;
  local_58.m_op.m_start = "==";
  local_58.m_op.m_size = 2;
  local_58.m_rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
  Catch::AssertionHandler::handleExpr(&local_e8,&local_58.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_e8);
  if (local_e8.m_completed == false) {
    (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1a0995;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression.m_result = false;
  local_58.super_ITransientExpression._10_6_ = 0;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x3b;
  capturedExpression_02.m_start = "std::memcmp(bv.data(), bin_val.data(), bin_val.size()) == 0";
  Catch::AssertionHandler::AssertionHandler
            (&local_e8,macroName_02,(SourceLineInfo *)&local_58,capturedExpression_02,
             ContinueOnFailure);
  iVar1 = memcmp(local_a0.m_lhs,optval_,0x20);
  local_58.super_ITransientExpression.m_result = iVar1 == 0;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001df410;
  local_58.super_ITransientExpression._12_4_ = iVar1;
  local_58.m_lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19f356;
  local_58.m_op.m_start = (char *)0x2;
  local_58.m_op.m_size = local_58.m_op.m_size & 0xffffffff00000000;
  Catch::AssertionHandler::handleExpr(&local_e8,&local_58.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_e8);
  if (local_e8.m_completed == false) {
    (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  if (local_a0.m_lhs !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90) {
    operator_delete(local_a0.m_lhs,(ulong)(local_90._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  operator_delete(optval_,0x20);
  return;
}

Assistant:

void check_bin_z85(T opt, zmq::socket_t &sock, std::string str_val)
{
    std::vector<uint8_t> bin_val(32);
    const auto dret = zmq_z85_decode(bin_val.data(), str_val.c_str());
    CHECK(dret != nullptr);

    sock.set(opt, str_val);
    sock.set(opt, zmq::buffer(bin_val));
    auto sv = sock.get(opt);
    CHECK(sv == str_val);

    auto bv = sock.get(opt, 32);
    REQUIRE(bv.size() == bin_val.size());
    CHECK(std::memcmp(bv.data(), bin_val.data(), bin_val.size()) == 0);
}